

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall kratos::ActiveVisitor::visit(ActiveVisitor *this,IfStmt *stmt)

{
  VarType VVar1;
  int iVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Port *pPVar6;
  mapped_type *pmVar7;
  VarException *pVVar8;
  ulong uVar9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar11;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  initializer_list<const_kratos::IRNode_*> __l_02;
  initializer_list<const_kratos::IRNode_*> __l_03;
  initializer_list<const_kratos::IRNode_*> __l_04;
  Port *local_e0;
  IfStmt *local_d8;
  Stmt *local_d0;
  undefined1 local_c8 [8];
  shared_ptr<kratos::Port> port_s;
  element_type *port;
  undefined1 local_a8 [8];
  shared_ptr<kratos::Port> port_1;
  string local_78;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_58;
  allocator_type local_31;
  
  peVar3 = (stmt->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (stmt->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  VVar1 = peVar3->type_;
  local_d8 = stmt;
  local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)stmt;
  if (VVar1 == Expression) {
    Var::as<kratos::Expr>((Var *)local_c8);
    if (((ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_c8 + 0x270))->
                _vptr__Sp_counted_base & 0xfffffffffffffffb) == 0) {
      Var::as<kratos::Var>
                ((Var *)&port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
      if (port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          [0x16]._M_use_count == 4) {
        Var::as<kratos::Port>((Var *)local_a8);
        if (*(PortType *)((long)local_a8 + 0x274) == Reset) {
          uVar4 = (this->reset_map_)._M_h._M_bucket_count;
          uVar9 = (ulong)local_a8 % uVar4;
          aVar10 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                    )((anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                       *)((this->reset_map_)._M_h._M_buckets + uVar9))->values_;
          aVar11.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0;
          if ((aVar10.values_ !=
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0) &&
             (in_R9.values_ =
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)((aVar10.values_)->field_0).named_args.data, aVar11 = aVar10,
             local_a8 != (undefined1  [8])((in_R9.values_)->field_0).string.size)) {
            while (aVar10 = in_R9,
                  in_R9.values_ =
                       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                        *)((aVar10.values_)->field_0).named_args.data,
                  (named_arg_info<char> *)in_R9.values_ != (named_arg_info<char> *)0x0) {
              pPVar6 = (Port *)((in_R9.values_)->field_0).string.size;
              aVar11.values_ =
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)0x0;
              if (((ulong)pPVar6 % uVar4 != uVar9) ||
                 (aVar11 = aVar10, local_a8 == (undefined1  [8])pPVar6)) goto LAB_00216786;
            }
            aVar11.values_ =
                 (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)0x0;
          }
LAB_00216786:
          if ((aVar11.values_ !=
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0) &&
             ((_Hash_node_base *)((aVar11.values_)->field_0).long_long_value !=
              (_Hash_node_base *)0x0)) {
            pVVar8 = (VarException *)__cxa_allocate_exception(0x10);
            (*(((Var *)local_a8)->super_IRNode)._vptr_IRNode[0x1f])
                      (&port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            local_58.
            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            format_str_02.size_ = 0xd;
            format_str_02.data_ = (char *)0x30;
            args_02.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args_02.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_58;
            fmt::v7::detail::vformat_abi_cxx11_
                      (&local_78,(detail *)"{0} is synchronous reset but used as async reset",
                       format_str_02,args_02);
            local_e0 = (Port *)local_a8;
            local_d0 = get_reset_stmt(this,(Port *)local_a8);
            __l_04._M_len = 3;
            __l_04._M_array = (iterator)&local_e0;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      (&local_58,__l_04,&local_31);
            VarException::VarException(pVVar8,&local_78,&local_58);
            __cxa_throw(pVVar8,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else if (*(PortType *)((long)local_a8 + 0x274) == AsyncReset) {
          uVar4 = (this->reset_map_)._M_h._M_bucket_count;
          uVar9 = (ulong)local_a8 % uVar4;
          aVar10 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                    )((anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                       *)((this->reset_map_)._M_h._M_buckets + uVar9))->values_;
          aVar11.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0;
          if ((aVar10.values_ !=
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0) &&
             (in_R9.values_ =
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)((aVar10.values_)->field_0).named_args.data, aVar11 = aVar10,
             local_a8 != (undefined1  [8])((in_R9.values_)->field_0).string.size)) {
            while (aVar10 = in_R9,
                  in_R9.values_ =
                       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                        *)((aVar10.values_)->field_0).named_args.data,
                  (named_arg_info<char> *)in_R9.values_ != (named_arg_info<char> *)0x0) {
              pPVar6 = (Port *)((in_R9.values_)->field_0).string.size;
              aVar11.values_ =
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)0x0;
              if (((ulong)pPVar6 % uVar4 != uVar9) ||
                 (aVar11 = aVar10, local_a8 == (undefined1  [8])pPVar6)) goto LAB_002166cf;
            }
            aVar11.values_ =
                 (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)0x0;
          }
LAB_002166cf:
          if ((aVar11.values_ ==
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0) ||
             ((_Hash_node_base *)((aVar11.values_)->field_0).long_long_value ==
              (_Hash_node_base *)0x0)) {
            pVVar8 = (VarException *)__cxa_allocate_exception(0x10);
            (*(((Var *)local_a8)->super_IRNode)._vptr_IRNode[0x1f])
                      (&port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            local_58.
            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            format_str_01.size_ = 0xd;
            format_str_01.data_ = (char *)0x23;
            args_01.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args_01.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_58;
            fmt::v7::detail::vformat_abi_cxx11_
                      (&local_78,(detail *)"{0} is used has a synchronous reset",format_str_01,
                       args_01);
            local_e0 = (Port *)local_a8;
            __l_03._M_len = 2;
            __l_03._M_array = (iterator)&local_e0;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      (&local_58,__l_03,&local_31);
            VarException::VarException(pVVar8,&local_78,&local_58);
            __cxa_throw(pVVar8,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
          local_78._M_dataplus._M_p = (pointer)local_a8;
          pmVar7 = std::__detail::
                   _Map_base<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->reset_map_,(key_type *)&local_78);
          if (*pmVar7 == true) {
            pVVar8 = (VarException *)__cxa_allocate_exception(0x10);
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"Active high signal used as active low","");
            local_58.
            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_a8;
            __l_01._M_len = 2;
            __l_01._M_array = (iterator)&local_58;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,__l_01,(allocator_type *)&local_e0);
            VarException::VarException
                      (pVVar8,&local_78,
                       (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            __cxa_throw(pVVar8,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        if (port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      if (port != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)port);
      }
    }
  }
  else {
    if (VVar1 != PortIO) goto LAB_002167c8;
    Var::as<kratos::Port>((Var *)local_c8);
    port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8;
    iVar2 = *(int *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((long)local_c8 + 0x270))->_vptr__Sp_counted_base + 4);
    if (iVar2 == 3) {
      uVar4 = (this->reset_map_)._M_h._M_bucket_count;
      uVar9 = (ulong)local_c8 % uVar4;
      aVar10 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                )((anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                   *)((this->reset_map_)._M_h._M_buckets + uVar9))->values_;
      aVar11.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           0x0;
      if ((aVar10.values_ !=
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           0x0) && (in_R9.values_ =
                         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                          *)((aVar10.values_)->field_0).named_args.data, aVar11 = aVar10,
                   local_c8 != (undefined1  [8])((in_R9.values_)->field_0).string.size)) {
        while (aVar10 = in_R9,
              in_R9.values_ =
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)((aVar10.values_)->field_0).named_args.data,
              (named_arg_info<char> *)in_R9.values_ != (named_arg_info<char> *)0x0) {
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((in_R9.values_)->field_0).string.size;
          aVar11.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0;
          if (((ulong)p_Var5 % uVar4 != uVar9) ||
             (aVar11 = aVar10, local_c8 == (undefined1  [8])p_Var5)) goto LAB_00216604;
        }
        aVar11.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             0x0;
      }
LAB_00216604:
      if ((aVar11.values_ !=
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           0x0) && ((_Hash_node_base *)((aVar11.values_)->field_0).long_long_value !=
                    (_Hash_node_base *)0x0)) {
        pVVar8 = (VarException *)__cxa_allocate_exception(0x10);
        (*(port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base[0x1f])
                  (&port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        format_str.size_ = 0xd;
        format_str.data_ = (char *)0x30;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_58;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_78,(detail *)"{0} is synchronous reset but used as async reset",format_str
                   ,args);
        local_e0 = (Port *)port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
        local_d0 = get_reset_stmt(this,(Port *)port_s.
                                               super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi);
        __l_00._M_len = 3;
        __l_00._M_array = (iterator)&local_e0;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  (&local_58,__l_00,(allocator_type *)local_a8);
        VarException::VarException(pVVar8,&local_78,&local_58);
        __cxa_throw(pVVar8,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else if (iVar2 == 2) {
      uVar4 = (this->reset_map_)._M_h._M_bucket_count;
      uVar9 = (ulong)local_c8 % uVar4;
      aVar10 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                )((anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                   *)((this->reset_map_)._M_h._M_buckets + uVar9))->values_;
      aVar11.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           0x0;
      if ((aVar10.values_ !=
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           0x0) && (in_R9.values_ =
                         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                          *)((aVar10.values_)->field_0).named_args.data, aVar11 = aVar10,
                   local_c8 != (undefined1  [8])((in_R9.values_)->field_0).string.size)) {
        while (aVar10 = in_R9,
              in_R9.values_ =
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)((aVar10.values_)->field_0).named_args.data,
              (named_arg_info<char> *)in_R9.values_ != (named_arg_info<char> *)0x0) {
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((in_R9.values_)->field_0).string.size;
          aVar11.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0;
          if (((ulong)p_Var5 % uVar4 != uVar9) ||
             (aVar11 = aVar10, local_c8 == (undefined1  [8])p_Var5)) goto LAB_0021654d;
        }
        aVar11.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             0x0;
      }
LAB_0021654d:
      if ((aVar11.values_ ==
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           0x0) || ((_Hash_node_base *)((aVar11.values_)->field_0).long_long_value ==
                    (_Hash_node_base *)0x0)) {
        pVVar8 = (VarException *)__cxa_allocate_exception(0x10);
        (*(port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base[0x1f])
                  (&port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        format_str_00.size_ = 0xd;
        format_str_00.data_ = (char *)0x23;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_58;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_78,(detail *)"{0} is used has a synchronous reset",format_str_00,args_00);
        local_e0 = (Port *)port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
        __l_02._M_len = 2;
        __l_02._M_array = (iterator)&local_e0;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  (&local_58,__l_02,(allocator_type *)local_a8);
        VarException::VarException(pVVar8,&local_78,&local_58);
        __cxa_throw(pVVar8,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
      pmVar7 = std::__detail::
               _Map_base<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->reset_map_,
                    (key_type *)
                    &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   );
      if (*pmVar7 == false) {
        pVVar8 = (VarException *)__cxa_allocate_exception(0x10);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"Active low signal used as active high","");
        local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        __l._M_len = 2;
        __l._M_array = (iterator)&local_58;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   __l,(allocator_type *)&local_e0);
        VarException::VarException
                  (pVVar8,&local_78,
                   (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        __cxa_throw(pVVar8,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  if (port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
LAB_002167c8:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void visit(IfStmt* stmt) override {
        auto predicate = stmt->predicate();
        // notice this just catch some simple mistakes
        // thus is designed to be zero false negative
        if (predicate->type() == VarType::PortIO) {
            auto port_s = predicate->as<Port>();
            auto* port = port_s.get();
            if (port->port_type() == PortType::AsyncReset) {
                if (reset_map_.find(port) == reset_map_.end()) {
                    // it's used as a sync reset
                    throw VarException(
                        ::format("{0} is used has a synchronous reset", port->to_string()),
                        {port, stmt});
                }
                bool reset_high = reset_map_.at(port);
                if (!reset_high)
                    throw VarException("Active low signal used as active high", {port, stmt});
            } else if (port->port_type() == PortType::Reset) {
                if (reset_map_.find(port) != reset_map_.end()) {
                    throw VarException(::format("{0} is synchronous reset but used as async reset",
                                                port->to_string()),
                                       {port, stmt, get_reset_stmt(port)});
                }
            }
        } else if (predicate->type() == VarType::Expression) {
            auto expr = predicate->as<Expr>();
            if (expr->op == ExprOp::UNot || expr->op == ExprOp::UInvert) {
                auto var = expr->left->as<Var>();
                if (var->type() == VarType::PortIO) {
                    auto port = var->as<Port>();
                    if (port->port_type() == PortType::AsyncReset) {
                        if (reset_map_.find(port.get()) == reset_map_.end()) {
                            // it's used as a sync reset
                            throw VarException(
                                ::format("{0} is used has a synchronous reset", port->to_string()),
                                {port.get(), stmt});
                        }
                        bool reset_high = reset_map_.at(port.get());
                        if (reset_high) {
                            throw VarException("Active high signal used as active low",
                                               {port.get(), stmt});
                        }
                    } else if (port->port_type() == PortType::Reset) {
                        if (reset_map_.find(port.get()) != reset_map_.end()) {
                            throw VarException(
                                ::format("{0} is synchronous reset but used as async reset",
                                         port->to_string()),
                                {port.get(), stmt, get_reset_stmt(port.get())});
                        }
                    }
                }
            }
        }
    }